

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O0

float lodepng::iccForwardTRC(LodePNGICCCurve *curve,float x)

{
  ulong uVar1;
  int *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  size_t index;
  float fraction;
  float v1;
  float v0;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_48;
  float local_3c;
  float local_38;
  float local_2c;
  undefined8 in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffe0;
  float local_4;
  
  local_4 = in_XMM0_Da;
  if (*in_RDI != 0) {
    if (*in_RDI == 1) {
      if (*(long *)(in_RDI + 2) == 0) {
        local_4 = 0.0;
      }
      else if (0.0 <= in_XMM0_Da) {
        local_2c = (float)(*(long *)(in_RDI + 4) - 1);
        uVar1 = (ulong)(in_XMM0_Da * local_2c);
        uVar1 = uVar1 | (long)(in_XMM0_Da * local_2c - 9.223372e+18) & (long)uVar1 >> 0x3f;
        if (uVar1 < *(ulong *)(in_RDI + 4)) {
          if (uVar1 + 1 < *(ulong *)(in_RDI + 4)) {
            local_38 = *(float *)(*(long *)(in_RDI + 2) + 4 + uVar1 * 4);
          }
          else {
            local_38 = 1.0;
          }
          local_3c = (float)(*(long *)(in_RDI + 4) - 1);
          local_48 = (float)uVar1;
          fVar2 = in_XMM0_Da * local_3c + -local_48;
          local_4 = *(float *)(*(long *)(in_RDI + 2) + uVar1 * 4) * (1.0 - fVar2) + local_38 * fVar2
          ;
        }
      }
    }
    else {
      fVar2 = (float)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
      if (*in_RDI == 2) {
        local_54 = in_XMM0_Da;
        if (0.0 < in_XMM0_Da) {
          local_54 = lodepng_powf(in_stack_ffffffffffffffe0,fVar2);
        }
        local_4 = local_54;
      }
      else if (*in_RDI == 3) {
        if (0.0 <= in_XMM0_Da) {
          if (in_XMM0_Da < -(float)in_RDI[8] / (float)in_RDI[7]) {
            local_58 = 0.0;
          }
          else {
            local_58 = lodepng_powf(in_stack_ffffffffffffffe0,fVar2);
            local_58 = local_58 + (float)in_RDI[9];
          }
          local_4 = local_58;
        }
      }
      else if (*in_RDI == 4) {
        if (0.0 <= in_XMM0_Da) {
          if (in_XMM0_Da < -(float)in_RDI[8] / (float)in_RDI[7]) {
            local_5c = (float)in_RDI[9];
          }
          else {
            local_5c = lodepng_powf(in_stack_ffffffffffffffe0,fVar2);
            local_5c = local_5c + (float)in_RDI[9];
          }
          local_4 = local_5c;
        }
      }
      else if (*in_RDI == 5) {
        if (in_XMM0_Da < (float)in_RDI[10]) {
          local_60 = (float)in_RDI[9] * in_XMM0_Da;
        }
        else {
          local_60 = lodepng_powf(in_stack_ffffffffffffffe0,fVar2);
        }
        local_4 = local_60;
      }
      else if (*in_RDI == 6) {
        if (in_XMM0_Da < (float)in_RDI[10]) {
          local_64 = (float)in_RDI[9] * in_XMM0_Da + (float)in_RDI[0xc];
        }
        else {
          local_64 = lodepng_powf(in_stack_ffffffffffffffe0,fVar2);
          local_64 = local_64 + (float)in_RDI[9];
        }
        local_4 = local_64;
      }
      else {
        local_4 = 0.0;
      }
    }
  }
  return local_4;
}

Assistant:

static float iccForwardTRC(const LodePNGICCCurve* curve, float x) {
  if(curve->type == 0) {
    return x;
  }
  if(curve->type == 1) { /* Lookup table */
    float v0, v1, fraction;
    size_t index;
    if(!curve->lut) return 0; /* error */
    if(x < 0) return x;
    index = (size_t)(x * (curve->lut_size - 1));
    if(index >= curve->lut_size) return x;

    /* LERP */
    v0 = curve->lut[index];
    v1 = (index + 1 < curve->lut_size) ? curve->lut[index + 1] : 1.0f;
    fraction = (x * (curve->lut_size - 1)) - index;
    return v0 * (1 - fraction) + v1 * fraction;
  }
  if(curve->type == 2) {
    /* Gamma expansion */
    return (x > 0) ? lodepng_powf(x, curve->gamma) : x;
  }
  /* TODO: all the ones below are untested */
  if(curve->type == 3) {
    if(x < 0) return x;
    return x >= (-curve->b / curve->a) ? (lodepng_powf(curve->a * x + curve->b, curve->gamma) + curve->c) : 0;
  }
  if(curve->type == 4) {
    if(x < 0) return x;
    return x >= (-curve->b / curve->a) ? (lodepng_powf(curve->a * x + curve->b, curve->gamma) + curve->c) : curve->c;
  }
  if(curve->type == 5) {
    return x >= curve->d ? (lodepng_powf(curve->a * x + curve->b, curve->gamma)) : (curve->c * x);
  }
  if(curve->type == 6) {
    return x >= curve->d ? (lodepng_powf(curve->a * x + curve->b, curve->gamma) + curve->c) : (curve->c * x + curve->f);
  }
  return 0;
}